

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::get_mutable_callback(session_impl *this,item *i,bool authoritative)

{
  bool local_9;
  int64_t local_8;
  
  local_8 = (i->m_seq).value;
  local_9 = authoritative;
  alert_manager::
  emplace_alert<libtorrent::dht_mutable_item_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,long,std::__cxx11::string_const&,libtorrent::entry_const&,bool_const&>
            (&this->m_alerts,&(i->m_pk).bytes,&(i->m_sig).bytes,&local_8,&i->m_salt,&i->m_value,
             &local_9);
  return;
}

Assistant:

void session_impl::get_mutable_callback(dht::item const& i
		, bool const authoritative)
	{
		TORRENT_ASSERT(i.is_mutable());
		m_alerts.emplace_alert<dht_mutable_item_alert>(i.pk().bytes
			, i.sig().bytes, i.seq().value
			, i.salt(), i.value(), authoritative);
	}